

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Array<unsigned_char> * __thiscall
kj::anon_unknown_8::DiskHandle::mmapPrivate
          (Array<unsigned_char> *__return_storage_ptr__,DiskHandle *this,uint64_t offset,
          uint64_t size)

{
  int __fd;
  int *piVar1;
  MmapRange MVar2;
  Fault local_48;
  Fault f;
  void *mapping;
  MmapRange range;
  uint64_t size_local;
  uint64_t offset_local;
  DiskHandle *this_local;
  
  MVar2 = getMmapRange(offset,size);
  range.offset = MVar2.size;
  __fd = AutoCloseFd::operator_cast_to_int(&this->fd);
  mapping = (void *)MVar2.offset;
  f.exception = (Exception *)::mmap((void *)0x0,range.offset,3,2,__fd,(__off_t)mapping);
  if (f.exception == (Exception *)0xffffffffffffffff) {
    piVar1 = __errno_location();
    kj::_::Debug::Fault::Fault
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x16a,*piVar1,"mmap","");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  Array<unsigned_char>::Array
            (__return_storage_ptr__,(uchar *)((long)f.exception + (offset - (long)mapping)),size,
             (ArrayDisposer *)&(anonymous_namespace)::mmapDisposer);
  return __return_storage_ptr__;
}

Assistant:

Array<byte> mmapPrivate(uint64_t offset, uint64_t size) const {
    auto range = getMmapRange(offset, size);
    void* mapping = ::mmap(NULL, range.size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<byte>(reinterpret_cast<byte*>(mapping) + (offset - range.offset),
                       size, mmapDisposer);
  }